

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionJITTimeInfo.cpp
# Opt level: O0

bool __thiscall FunctionJITTimeInfo::ForceJITLoopBody(FunctionJITTimeInfo *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  JITTimeFunctionBody *pJVar4;
  byte local_25;
  byte local_11;
  FunctionJITTimeInfo *this_local;
  
  uVar2 = GetSourceContextId(this);
  uVar3 = GetLocalFunctionId(this);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,JITLoopBodyPhase,uVar2,uVar3);
  local_11 = 0;
  if (!bVar1) {
    uVar2 = GetSourceContextId(this);
    uVar3 = GetLocalFunctionId(this);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FullJitPhase,uVar2,uVar3);
    local_11 = 0;
    if (!bVar1) {
      pJVar4 = GetBody(this);
      bVar1 = JITTimeFunctionBody::IsGenerator(pJVar4);
      local_11 = 0;
      if (!bVar1) {
        pJVar4 = GetBody(this);
        bVar1 = JITTimeFunctionBody::HasTry(pJVar4);
        local_11 = 0;
        if (!bVar1) {
          uVar2 = GetSourceContextId(this);
          uVar3 = GetLocalFunctionId(this);
          bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,JITLoopBodyPhase,uVar2,uVar3);
          local_25 = 1;
          if (!bVar1) {
            local_25 = DAT_01eb89ea;
          }
          local_11 = local_25;
        }
      }
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool
FunctionJITTimeInfo::ForceJITLoopBody() const
{
    return
        !PHASE_OFF(Js::JITLoopBodyPhase, this) &&
        !PHASE_OFF(Js::FullJitPhase, this) &&
        !GetBody()->IsGenerator() &&
        !GetBody()->HasTry() &&
        (
            PHASE_FORCE(Js::JITLoopBodyPhase, this)
#ifdef ENABLE_PREJIT
            || Js::Configuration::Global.flags.Prejit
#endif
            );
}